

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O2

void anon_unknown.dwarf_3ee9::test_range_cardinality(void **param_1)

{
  roaring64_bitmap_t *prVar1;
  uint64_t uVar2;
  uint64_t auStack_70 [8];
  
  prVar1 = roaring64_bitmap_create();
  roaring64_bitmap_add(prVar1,0);
  roaring64_bitmap_add(prVar1,100000);
  roaring64_bitmap_add(prVar1,0x186a1);
  roaring64_bitmap_add(prVar1,0x186a2);
  roaring64_bitmap_add(prVar1,200000);
  uVar2 = roaring64_bitmap_range_cardinality(prVar1,0,0);
  _assert_int_equal(uVar2,0,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x30e);
  uVar2 = roaring64_bitmap_range_cardinality(prVar1,0,100000);
  _assert_int_equal(uVar2,1,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x30f);
  uVar2 = roaring64_bitmap_range_cardinality(prVar1,1,0x186a1);
  _assert_int_equal(uVar2,1,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x310);
  uVar2 = roaring64_bitmap_range_cardinality(prVar1,0,0x30d41);
  _assert_int_equal(uVar2,5,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x311);
  roaring64_bitmap_free(prVar1);
  prVar1 = roaring64_bitmap_create();
  roaring64_bitmap_add_range_closed(prVar1,0xfffffffffffefff5,0xffffffffffff0009);
  uVar2 = roaring64_bitmap_range_cardinality(prVar1,0xfffffffffffdffff,0xffffffffffffffff);
  _assert_int_equal(uVar2,0x15,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x31c);
  uVar2 = roaring64_bitmap_range_cardinality(prVar1,0xfffffffffffefff5,0xfffffffffffff00a);
  _assert_int_equal(uVar2,0x15,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,800);
  roaring64_bitmap_free(prVar1);
  prVar1 = roaring64_bitmap_create();
  roaring64_bitmap_add(prVar1,0xfffffffffffffc17);
  roaring64_bitmap_add(prVar1,0xfffffffffffffc7b);
  roaring64_bitmap_add(prVar1,0xfffffffffffffc7c);
  roaring64_bitmap_add(prVar1,0xfffffffffffffce0);
  uVar2 = roaring64_bitmap_range_cardinality(prVar1,0xfffffffffffffc17,0xfffffffffffffc7b);
  _assert_int_equal(uVar2,1,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x32e);
  uVar2 = roaring64_bitmap_range_cardinality(prVar1,0xfffffffffffffc17,0xffffffffffffffff);
  _assert_int_equal(uVar2,4,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x330);
  roaring64_bitmap_add(prVar1,0xffffffffffffffff);
  uVar2 = roaring64_bitmap_range_cardinality(prVar1,0xfffffffffffffc17,0xffffffffffffffff);
  _assert_int_equal(uVar2,4,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x334);
  uVar2 = roaring64_bitmap_range_closed_cardinality(prVar1,0xfffffffffffffc17,0xffffffffffffffff);
  _assert_int_equal(uVar2,5,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x337);
  roaring64_bitmap_free(prVar1);
  auStack_70[0] = 0;
  auStack_70[1] = 1;
  auStack_70[2] = 2;
  auStack_70[3] = 3;
  auStack_70[4] = 4;
  auStack_70[5] = 5;
  auStack_70[6] = 0xffffffffffffffff;
  prVar1 = roaring64_bitmap_of_ptr(7,auStack_70);
  uVar2 = roaring64_bitmap_range_cardinality(prVar1,1,1);
  _assert_int_equal(uVar2,0,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x340);
  uVar2 = roaring64_bitmap_range_cardinality(prVar1,1,0);
  _assert_int_equal(uVar2,0,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x341);
  uVar2 = roaring64_bitmap_range_cardinality(prVar1,0xffffffffffffffff,0);
  _assert_int_equal(uVar2,0,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x343);
  uVar2 = roaring64_bitmap_range_cardinality(prVar1,0xffffffffffffffff,0xffffffffffffffff);
  _assert_int_equal(uVar2,0,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x345);
  uVar2 = roaring64_bitmap_range_closed_cardinality(prVar1,1,0);
  _assert_int_equal(uVar2,0,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x346);
  uVar2 = roaring64_bitmap_range_closed_cardinality(prVar1,0xffffffffffffffff,0);
  _assert_int_equal(uVar2,0,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x348);
  uVar2 = roaring64_bitmap_range_closed_cardinality(prVar1,0xffffffffffffffff,0xfffffffffffffffe);
  _assert_int_equal(uVar2,0,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x34b);
  roaring64_bitmap_free(prVar1);
  return;
}

Assistant:

DEFINE_TEST(test_range_cardinality) {
    {
        roaring64_bitmap_t* r = roaring64_bitmap_create();

        roaring64_bitmap_add(r, 0);
        roaring64_bitmap_add(r, 100000);
        roaring64_bitmap_add(r, 100001);
        roaring64_bitmap_add(r, 100002);
        roaring64_bitmap_add(r, 200000);

        assert_int_equal(roaring64_bitmap_range_cardinality(r, 0, 0), 0);
        assert_int_equal(roaring64_bitmap_range_cardinality(r, 0, 100000), 1);
        assert_int_equal(roaring64_bitmap_range_cardinality(r, 1, 100001), 1);
        assert_int_equal(roaring64_bitmap_range_cardinality(r, 0, 200001), 5);

        roaring64_bitmap_free(r);
    }
    {
        // Range extending into the max container
        roaring64_bitmap_t* r = roaring64_bitmap_create();
        roaring64_bitmap_add_range_closed(r, UINT64_MAX - 0x10000 - 10,
                                          UINT64_MAX - 0x10000 + 10);
        assert_int_equal(roaring64_bitmap_range_cardinality(
                             r, UINT64_MAX - 0x20000, UINT64_MAX),
                         21);
        assert_int_equal(
            roaring64_bitmap_range_cardinality(r, UINT64_MAX - 0x10000 - 10,
                                               UINT64_MAX - 0x1000 + 11),
            21);
        roaring64_bitmap_free(r);
    }
    {
        // Range fully inside max container
        roaring64_bitmap_t* r = roaring64_bitmap_create();
        uint64_t start = UINT64_MAX - 1000;

        roaring64_bitmap_add(r, start + 0);
        roaring64_bitmap_add(r, start + 100);
        roaring64_bitmap_add(r, start + 101);
        roaring64_bitmap_add(r, start + 201);

        assert_int_equal(
            roaring64_bitmap_range_cardinality(r, start, start + 100), 1);
        assert_int_equal(
            roaring64_bitmap_range_cardinality(r, start, UINT64_MAX), 4);
        roaring64_bitmap_add(r, UINT64_MAX);
        // range is exclusive, so UINT64_MAX is not included
        assert_int_equal(
            roaring64_bitmap_range_cardinality(r, start, UINT64_MAX), 4);
        // With an inclusive range, UINT64_MAX _is_ included
        assert_int_equal(
            roaring64_bitmap_range_closed_cardinality(r, start, UINT64_MAX), 5);

        roaring64_bitmap_free(r);
    }
    {
        // Empty ranges always have zero cardinality
        roaring64_bitmap_t* r =
            roaring64_bitmap_from(0, 1, 2, 3, 4, 5, UINT64_MAX);

        assert_int_equal(roaring64_bitmap_range_cardinality(r, 1, 1), 0);
        assert_int_equal(roaring64_bitmap_range_cardinality(r, 1, 0), 0);
        assert_int_equal(roaring64_bitmap_range_cardinality(r, UINT64_MAX, 0),
                         0);
        assert_int_equal(
            roaring64_bitmap_range_cardinality(r, UINT64_MAX, UINT64_MAX), 0);
        assert_int_equal(roaring64_bitmap_range_closed_cardinality(r, 1, 0), 0);
        assert_int_equal(
            roaring64_bitmap_range_closed_cardinality(r, UINT64_MAX, 0), 0);
        assert_int_equal(roaring64_bitmap_range_closed_cardinality(
                             r, UINT64_MAX, UINT64_MAX - 1),
                         0);

        roaring64_bitmap_free(r);
    }
}